

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool duckdb::AddPropagateStatistics::Operation<long,duckdb::TryDecimalAdd>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  Value *this;
  int64_t in_RDI;
  long max;
  long min;
  Value *in_stack_ffffffffffffff28;
  int64_t in_stack_ffffffffffffff30;
  BaseStatistics *in_stack_ffffffffffffff80;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  NumericStats::GetMin<long>(in_stack_ffffffffffffff80);
  NumericStats::GetMin<long>(in_stack_ffffffffffffff80);
  bVar1 = TryDecimalAdd::Operation<long,long,long>
                    (in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28,
                     (int64_t *)0x1275733);
  if (bVar1) {
    this = (Value *)NumericStats::GetMax<long>(in_stack_ffffffffffffff80);
    NumericStats::GetMax<long>(in_stack_ffffffffffffff80);
    bVar1 = TryDecimalAdd::Operation<long,long,long>
                      ((int64_t)this,(int64_t)in_stack_ffffffffffffff28,(int64_t *)0x1275778);
    if (bVar1) {
      Value::Numeric((LogicalType *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
      Value::operator=(this,in_stack_ffffffffffffff28);
      Value::~Value(this);
      Value::Numeric((LogicalType *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     in_RDI);
      Value::operator=(this,in_stack_ffffffffffffff28);
      Value::~Value(this);
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		// new min is min+min
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMin<T>(rstats), min)) {
			return true;
		}
		// new max is max+max
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMax<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}